

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

void __thiscall QFileDialogPrivate::updateOkButton(QFileDialogPrivate *this)

{
  QFileDialog *this_00;
  QDialogButtonBox *this_01;
  QFileSystemModel *pQVar1;
  qsizetype qVar2;
  char cVar3;
  bool bVar4;
  AcceptMode AVar5;
  FileMode FVar6;
  QWidget *this_02;
  undefined1 *puVar7;
  bool enable;
  char16_t *tmp;
  char16_t *pcVar8;
  StandardButton which;
  QFileDialogPrivate *pQVar9;
  char16_t *pcVar10;
  char16_t *tmp_1;
  longlong __tmp;
  long lVar11;
  QString *file;
  QString *string;
  long in_FS_OFFSET;
  QLatin1StringView s;
  undefined1 *local_138;
  Data *local_130;
  Data *local_128;
  undefined1 local_120 [8];
  QArrayDataPointer<char16_t> local_118;
  QFileInfo info;
  QArrayDataPointer<char16_t> local_f8;
  QArrayDataPointer<char16_t> local_d8;
  undefined8 local_b8;
  char16_t *pcStack_b0;
  undefined1 *local_a8;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFileDialog **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  this_01 = (QDialogButtonBox *)((this->qFileDialogUi).d)->buttonBox;
  AVar5 = QFileDialog::acceptMode(this_00);
  which = Save;
  if (AVar5 == AcceptOpen) {
    which = Open;
  }
  this_02 = (QWidget *)QDialogButtonBox::button(this_01,which);
  if (this_02 == (QWidget *)0x0) goto LAB_0049cbff;
  FVar6 = QFileDialog::fileMode(this_00);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  QFileDialog::selectedFiles((QStringList *)&local_58,this_00);
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QLineEdit::text((QString *)&local_78,&((this->qFileDialogUi).d)->fileNameEdit->super_QLineEdit);
  cVar3 = QString::startsWith((QLatin1String *)&local_78,2);
  if ((cVar3 == '\0') &&
     (cVar3 = QString::startsWith((QChar)(char16_t)&local_78,0x5c), cVar3 == '\0')) {
    if ((undefined1 *)local_58.size == (undefined1 *)0x0) {
      enable = false;
      bVar4 = false;
    }
    else {
      local_98.d = (Data *)0x2;
      local_98.ptr = L"..";
      bVar4 = ::operator==((QString *)&local_78,(QLatin1StringView *)&local_98);
      enable = true;
      if (bVar4) {
        bVar4 = true;
      }
      else {
        enable = true;
        switch(FVar6) {
        case AnyFile:
          local_98.d = ((local_58.ptr)->d).d;
          local_98.ptr = ((local_58.ptr)->d).ptr;
          local_98.size = ((local_58.ptr)->d).size;
          if (local_98.d != (Data *)0x0) {
            LOCK();
            ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          _info = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
          QFileInfo::QFileInfo(&info,(QString *)&local_98);
          local_a8 = &DAT_aaaaaaaaaaaaaaaa;
          local_b8 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          pcStack_b0 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          QFileSystemModel::index((QString *)&local_b8,(int)this->model);
          local_d8.d = (Data *)0x0;
          local_d8.ptr = (char16_t *)0x0;
          local_d8.size = 0;
          local_f8.d = (Data *)0x0;
          local_f8.ptr = (char16_t *)0x0;
          local_f8.size = 0;
          cVar3 = QFileInfo::isDir();
          if (cVar3 == '\0') {
            QString::lastIndexOf((QString *)&local_98,(QChar)0x2f,CaseSensitive);
            QString::mid((longlong)&local_118,(longlong)&local_98);
            puVar7 = (undefined1 *)local_118.size;
            pcVar8 = local_118.ptr;
            local_128 = local_118.d;
            local_d8.d = local_118.d;
            local_118.d = (Data *)0x0;
            local_d8.ptr = local_118.ptr;
            local_118.ptr = (char16_t *)0x0;
            local_118.size = 0;
            local_d8.size = (qsizetype)puVar7;
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
            QString::mid((longlong)&local_118,(longlong)&local_98);
            local_138 = (undefined1 *)local_118.size;
            pcVar10 = local_118.ptr;
            local_130 = local_118.d;
            local_f8.d = local_118.d;
            local_118.d = (Data *)0x0;
            local_f8.ptr = local_118.ptr;
            local_118.ptr = (char16_t *)0x0;
            local_118.size = 0;
            local_f8.size = (qsizetype)local_138;
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
          }
          else {
            QFileInfo::canonicalFilePath();
            puVar7 = (undefined1 *)local_118.size;
            pcVar8 = local_118.ptr;
            local_128 = local_118.d;
            local_d8.d = local_118.d;
            local_118.d = (Data *)0x0;
            local_d8.ptr = local_118.ptr;
            local_118.ptr = (char16_t *)0x0;
            local_118.size = 0;
            local_d8.size = (qsizetype)puVar7;
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
            local_138 = (undefined1 *)0x0;
            pcVar10 = (char16_t *)0x0;
            local_130 = (Data *)0x0;
          }
          s.m_data = "..";
          s.m_size = 2;
          bVar4 = QString::contains((QString *)&local_78,s,CaseSensitive);
          if (bVar4) {
            QFileInfo::canonicalFilePath();
            local_d8.d = local_118.d;
            local_118.d = local_128;
            local_d8.ptr = local_118.ptr;
            local_d8.size = local_118.size;
            local_118.ptr = pcVar8;
            local_118.size = (qsizetype)puVar7;
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
            QFileInfo::fileName();
            qVar2 = local_118.size;
            local_f8.d = local_118.d;
            local_118.d = local_130;
            local_f8.ptr = local_118.ptr;
            local_f8.size = local_118.size;
            local_118.size = (qsizetype)local_138;
            local_118.ptr = pcVar10;
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
            local_138 = (undefined1 *)qVar2;
          }
          QFileDialog::directory((QFileDialog *)local_120);
          QDir::canonicalPath();
          bVar4 = ::comparesEqual((QString *)&local_d8,(QString *)&local_118);
          if (bVar4) {
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
            QDir::~QDir((QDir *)local_120);
            if (local_138 != (undefined1 *)0x0) goto LAB_0049cb16;
            bVar4 = false;
            enable = false;
          }
          else {
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
            QDir::~QDir((QDir *)local_120);
LAB_0049cb16:
            if (local_a8 != (undefined1 *)0x0 && -1 < (int)((uint)local_b8 | local_b8._4_4_)) {
              cVar3 = QFileSystemModel::isDir((QModelIndex *)this->model);
              bVar4 = true;
              enable = true;
              if (cVar3 != '\0') goto LAB_0049cba1;
            }
            enable = true;
            if (((((int)(uint)local_b8 < 0) || ((int)local_b8._4_4_ < 0)) ||
                (local_a8 == (undefined1 *)0x0)) &&
               (puVar7 = (undefined1 *)maxNameLength((QString *)&local_d8), -1 < (long)puVar7)) {
              enable = local_138 <= puVar7;
            }
            bVar4 = false;
          }
LAB_0049cba1:
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
          QFileInfo::~QFileInfo(&info);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
          break;
        case ExistingFile:
        case ExistingFiles:
          enable = false;
          string = local_58.ptr;
          for (lVar11 = local_58.size * 0x18; lVar11 != 0; lVar11 = lVar11 + -0x18) {
            local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_98.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            pQVar9 = (QFileDialogPrivate *)this->model;
            QFileSystemModel::index((QString *)&local_98,(int)pQVar9);
            if ((((int)local_98.d < 0) || ((long)local_98.d < 0)) ||
               ((undefined1 *)local_98.size == (undefined1 *)0x0)) {
              pQVar1 = this->model;
              getEnvironmentVariable((QString *)&local_d8,pQVar9,string);
              QFileSystemModel::index((QString *)&local_b8,(int)pQVar1);
              local_98.size = (qsizetype)local_a8;
              local_98.d = local_b8;
              local_98.ptr = pcStack_b0;
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
              bVar4 = enable;
              if ((((int)local_98.d < 0) || ((long)local_98.d < 0)) ||
                 ((undefined1 *)local_98.size == (undefined1 *)0x0)) goto LAB_0049cbce;
            }
            cVar3 = QFileSystemModel::isDir((QModelIndex *)this->model);
            if (cVar3 != '\0') {
              enable = true;
              bVar4 = enable;
              goto LAB_0049cbce;
            }
            string = string + 1;
          }
          enable = true;
          bVar4 = false;
          break;
        case Directory:
          local_98.d = ((local_58.ptr)->d).d;
          local_98.ptr = ((local_58.ptr)->d).ptr;
          local_98.size = ((local_58.ptr)->d).size;
          if (local_98.d != (Data *)0x0) {
            LOCK();
            ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_a8 = &DAT_aaaaaaaaaaaaaaaa;
          local_b8 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          pcStack_b0 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          pQVar9 = (QFileDialogPrivate *)this->model;
          QFileSystemModel::index((QString *)&local_b8,(int)pQVar9);
          if ((((int)(uint)local_b8 < 0) || ((long)local_b8 < 0)) || (local_a8 == (undefined1 *)0x0)
             ) {
            pQVar1 = this->model;
            getEnvironmentVariable((QString *)&local_f8,pQVar9,(QString *)&local_98);
            QFileSystemModel::index((QString *)&local_d8,(int)pQVar1);
            local_a8 = (undefined1 *)local_d8.size;
            local_b8 = local_d8.d;
            pcStack_b0 = local_d8.ptr;
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
            if (((-1 < (int)(uint)local_b8) && (-1 < (long)local_b8)) &&
               (local_a8 != (undefined1 *)0x0)) goto LAB_0049c8e8;
LAB_0049c902:
            enable = false;
          }
          else {
LAB_0049c8e8:
            cVar3 = QFileSystemModel::isDir((QModelIndex *)this->model);
            enable = true;
            if (cVar3 == '\0') goto LAB_0049c902;
          }
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
        default:
          bVar4 = false;
        }
      }
    }
LAB_0049cbce:
    QWidget::setEnabled(this_02,enable);
  }
  else {
    QWidget::setEnabled(this_02,true);
    bVar4 = false;
  }
  updateOkButtonText(this,bVar4);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
LAB_0049cbff:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileDialogPrivate::updateOkButton()
{
    Q_Q(QFileDialog);
    QPushButton *button =  qFileDialogUi->buttonBox->button((q->acceptMode() == QFileDialog::AcceptOpen)
                    ? QDialogButtonBox::Open : QDialogButtonBox::Save);
    if (!button)
        return;
    const QFileDialog::FileMode fileMode = q->fileMode();

    bool enableButton = true;
    bool isOpenDirectory = false;

    const QStringList files = q->selectedFiles();
    QString lineEditText = lineEdit()->text();

    if (lineEditText.startsWith("//"_L1) || lineEditText.startsWith(u'\\')) {
        button->setEnabled(true);
        updateOkButtonText();
        return;
    }

    if (files.isEmpty()) {
        enableButton = false;
    } else if (lineEditText == ".."_L1) {
        isOpenDirectory = true;
    } else {
        switch (fileMode) {
        case QFileDialog::Directory: {
            QString fn = files.first();
            QModelIndex idx = model->index(fn);
            if (!idx.isValid())
                idx = model->index(getEnvironmentVariable(fn));
            if (!idx.isValid() || !model->isDir(idx))
                enableButton = false;
            break;
        }
        case QFileDialog::AnyFile: {
            QString fn = files.first();
            QFileInfo info(fn);
            QModelIndex idx = model->index(fn);
            QString fileDir;
            QString fileName;
            if (info.isDir()) {
                fileDir = info.canonicalFilePath();
            } else {
                fileDir = fn.mid(0, fn.lastIndexOf(u'/'));
                fileName = fn.mid(fileDir.size() + 1);
            }
            if (lineEditText.contains(".."_L1)) {
                fileDir = info.canonicalFilePath();
                fileName = info.fileName();
            }

            if (fileDir == q->directory().canonicalPath() && fileName.isEmpty()) {
                enableButton = false;
                break;
            }
            if (idx.isValid() && model->isDir(idx)) {
                isOpenDirectory = true;
                enableButton = true;
                break;
            }
            if (!idx.isValid()) {
                const long maxLength = maxNameLength(fileDir);
                enableButton = maxLength < 0 || fileName.size() <= maxLength;
            }
            break;
        }
        case QFileDialog::ExistingFile:
        case QFileDialog::ExistingFiles:
            for (const auto &file : files) {
                QModelIndex idx = model->index(file);
                if (!idx.isValid())
                    idx = model->index(getEnvironmentVariable(file));
                if (!idx.isValid()) {
                    enableButton = false;
                    break;
                }
                if (idx.isValid() && model->isDir(idx)) {
                    isOpenDirectory = true;
                    break;
                }
            }
            break;
        default:
            break;
        }
    }

    button->setEnabled(enableButton);
    updateOkButtonText(isOpenDirectory);
}